

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O1

void __thiscall
cfd::core::CfdCoreManager::Initialize(CfdCoreManager *this,CfdCoreHandle *handle_address)

{
  pointer *pppiVar1;
  iterator __position;
  int iVar2;
  CfdException *pCVar3;
  int *handle;
  undefined1 local_60 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  if (handle_address == (CfdCoreHandle *)0x0) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_60._0_8_ = local_60 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,"cfd::core::Initialize parameter NULL.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_60);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (this->finalized_ == true) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_60._0_8_ = local_60 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,"cfd::core::Initialize already finalized.","");
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_60);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    if ((this->initialized_ == false) &&
       ((this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      InitializeLogger();
      wally_init(0);
      RandomNumberUtil::GetRandomBytes(&local_40,0x20);
      iVar2 = wally_secp_randomize
                        (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (long)local_40.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_40.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      if (iVar2 != 0) goto LAB_00408105;
      this->initialized_ = true;
      if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new__(4);
    __position._M_current =
         (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                ((vector<int*,std::allocator<int*>> *)&this->handle_list_,__position,
                 (int **)&local_40);
    }
    else {
      *__position._M_current =
           (int *)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
      pppiVar1 = &(this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppiVar1 = *pppiVar1 + 1;
    }
    *handle_address =
         local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_60._0_8_ = "cfdcore_manager.cpp";
    local_60._8_4_ = 0x60;
    local_60._16_8_ = "Initialize";
    logger::log<void*&>((CfdSourceLocation *)local_60,kCfdLogLevelInfo,"core initialize. addr={:p}."
                        ,handle_address);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  ::std::__throw_system_error(iVar2);
LAB_00408105:
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_60._0_8_ = local_60 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"Failed to secp_randomize error.","");
  CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_60);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void CfdCoreManager::Initialize(CfdCoreHandle* handle_address) {
  if (handle_address == nullptr) {
    throw CfdException(
        kCfdIllegalArgumentError, "cfd::core::Initialize parameter NULL.");
  }
  if (finalized_) {
    throw CfdException(
        kCfdIllegalStateError, "cfd::core::Initialize already finalized.");
  }

  {
    // Start of exclusive control
    std::lock_guard<std::mutex> lock(mutex_);
    if ((!initialized_) && handle_list_.empty()) {
      // Perform initialization processing.
      InitializeLogger();

      // Since libwally does not produce errors other than its arguments,
      // will only call the function.
      wally_init(0);

      std::vector<uint8_t> data =
          RandomNumberUtil::GetRandomBytes(WALLY_SECP_RANDOMIZE_LEN);
      int wally_ret = wally_secp_randomize(data.data(), data.size());
      if (wally_ret != WALLY_OK) {
        throw CfdException(
            kCfdIllegalStateError, "Failed to secp_randomize error.");
      }
#if 0
      int wally_ret = wally_init(0);
      if (wally_ret != WALLY_OK) {
        throw CfdException(kCfdInternalError,
                           "cfd::core::Initialize parameter NULL.");
      }
#endif

#if 0
      int hidapi_ret = hid_init();
      if (hidapi_ret != 0) {
        error(CFD_LOG_SOURCE, "hid_init error.");
        // TBD:
        // With the error of HIDAPI, should error be ignored?
        // → Pass thru core, check separately the wallet side.
        // throw CfdException(kCfdInternalError, "hid_init error.");
      }
#endif

      initialized_ = true;
    }

    // Generation and registration of handle
    int* handle = new int[1];
    handle_list_.push_back(handle);
    *handle_address = static_cast<void*>(handle);
    info(CFD_LOG_SOURCE, "core initialize. addr={:p}.", *handle_address);
  }
}